

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc2.c
# Opt level: O0

void OP_gcscan2(void)

{
  LispPTR local_10;
  int scan;
  
  if ((MachineState.tosvalue & 0xfff0000) == 0xe0000) {
    local_10 = gcscan2(MachineState.tosvalue & 0xffff);
    if (local_10 == 0xffffffff) {
      local_10 = 0;
    }
    else {
      local_10 = local_10 | 0xe0000;
    }
    MachineState.tosvalue = local_10;
  }
  MachineState.currentpc = MachineState.currentpc + 1;
  return;
}

Assistant:

void OP_gcscan2(void) {
  int scan;
#ifdef TRACE
  printPC();
  printf("TRACE: OP_gcscan2()\n");
#endif
  if ((TopOfStack & SEGMASK) == S_POSITIVE) {
    scan = gcscan2(LOLOC(TopOfStack));
    TopOfStack = (scan == -1) ? NIL : scan | S_POSITIVE;
  }
  PC++;
}